

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

ostream * pstore::operator<<(ostream *stream,uuid *m)

{
  ostream *poVar1;
  string local_38 [32];
  uuid *local_18;
  uuid *m_local;
  ostream *stream_local;
  
  local_18 = m;
  m_local = (uuid *)stream;
  uuid::str_abi_cxx11_((uuid *)local_38);
  poVar1 = std::operator<<(stream,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid const & m) { return stream << m.str (); }